

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

void ODDLParser::logInvalidTokenError(char *in,string *exp,logCallback callback)

{
  logCallback p_Var1;
  string *psVar2;
  ostream *poVar3;
  string local_220;
  string local_200 [8];
  string part;
  string local_1d8 [8];
  string full;
  stringstream local_1a8 [8];
  stringstream stream;
  ostream local_198 [376];
  logCallback local_20;
  logCallback callback_local;
  string *exp_local;
  char *in_local;
  
  local_20 = callback;
  callback_local = (logCallback)exp;
  exp_local = (string *)in;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar3 = std::operator<<(local_198,"Invalid token \"");
  poVar3 = std::operator<<(poVar3,(char)exp_local->_M_dataplus);
  poVar3 = std::operator<<(poVar3,"\"");
  poVar3 = std::operator<<(poVar3," expected \"");
  poVar3 = std::operator<<(poVar3,(string *)callback_local);
  poVar3 = std::operator<<(poVar3,"\"");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  psVar2 = exp_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1d8,(char *)psVar2,(allocator *)(part.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(part.field_2._M_local_buf + 0xf));
  std::__cxx11::string::substr((ulong)local_200,(ulong)local_1d8);
  std::operator<<(local_198,local_200);
  p_Var1 = local_20;
  std::__cxx11::stringstream::str();
  (*p_Var1)(ddl_error_msg,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

static void logInvalidTokenError( char *in, const std::string &exp, OpenDDLParser::logCallback callback ) {
    std::stringstream stream;
    stream << "Invalid token \"" << *in << "\"" << " expected \"" << exp << "\"" << std::endl;
    std::string full( in );
    std::string part( full.substr( 0, 50 ) );
    stream << part;
    callback( ddl_error_msg, stream.str() );
}